

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestTestCommand::InitializeHandler(cmCTestTestCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  cmValue cVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  cmDuration t;
  char local_20a;
  allocator<char> local_209;
  cmAlphaNum local_208;
  unsigned_long testLoad;
  ostringstream cmCTestLog_msg;
  string local_40;
  cmCTestTestHandler *this_00;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_TEST_TIMEOUT",(allocator<char> *)&local_208);
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar5.Value == (string *)0x0) {
    t = cmCTest::GetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    if (t.__r <= 0.0) {
      t.__r = 600.0;
    }
  }
  else {
    t.__r = atof(((cVar5.Value)->_M_dataplus)._M_p);
  }
  cmCTest::SetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,t);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_RESOURCE_SPEC_FILE",(allocator<char> *)&local_208);
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar5.Value != (string *)0x0 && (this->ResourceSpecFile)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
  }
  iVar4 = (*(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
            [9])(this);
  this_00 = (cmCTestTestHandler *)CONCAT44(extraout_var,iVar4);
  if ((((this->Start)._M_string_length != 0) || ((this->End)._M_string_length != 0)) ||
     ((this->Stride)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testLoad,"TestsToRunInformation",&local_209);
    _cmCTestLog_msg = (pointer)(this->Start)._M_string_length;
    local_208.View_._M_str = local_208.Digits_;
    local_208.View_._M_len = (size_t)&DAT_00000001;
    local_208.Digits_[0] = ',';
    local_20a = ',';
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
              (&local_40,(cmAlphaNum *)&cmCTestLog_msg,&local_208,&this->End,&local_20a,
               &this->Stride);
    cmCTestGenericHandler::SetOption((cmCTestGenericHandler *)this_00,(string *)&testLoad,&local_40)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&testLoad);
  }
  if ((this->Exclude)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ExcludeRegularExpression",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,(cmValue)&this->Exclude);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->Include)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"IncludeRegularExpression",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,(cmValue)&this->Include);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ExcludeLabel)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ExcludeLabelRegularExpression",
               (allocator<char> *)&local_208);
    cmCTestGenericHandler::AddMultiOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,&this->ExcludeLabel);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->IncludeLabel)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"LabelRegularExpression",(allocator<char> *)&local_208);
    cmCTestGenericHandler::AddMultiOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,&this->IncludeLabel);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ExcludeFixture)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ExcludeFixtureRegularExpression",
               (allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ExcludeFixture);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ExcludeFixtureSetup)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ExcludeFixtureSetupRegularExpression",
               (allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ExcludeFixtureSetup);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ExcludeFixtureCleanup)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ExcludeFixtureCleanupRegularExpression",
               (allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ExcludeFixtureCleanup);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if (this->StopOnFailure == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"StopOnFailure",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,"ON");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ParallelLevel)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ParallelLevel",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ParallelLevel);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->Repeat)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"Repeat",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,(cmValue)&this->Repeat);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ScheduleRandom)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ScheduleRandom",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ScheduleRandom);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->ResourceSpecFile)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ResourceSpecFile",(allocator<char> *)&local_208);
    cmCTestGenericHandler::SetOption
              ((cmCTestGenericHandler *)this_00,(string *)&cmCTestLog_msg,
               (cmValue)&this->ResourceSpecFile);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  if ((this->StopTime)._M_string_length != 0) {
    cmCTest::SetStopTime
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&this->StopTime);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_TEST_LOAD",(allocator<char> *)&local_208);
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if ((this->TestLoad)._M_string_length == 0) {
    if ((cVar5.Value == (string *)0x0) || ((cVar5.Value)->_M_string_length == 0)) {
      testLoad = cmCTest::GetTestLoad
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
      goto LAB_001a0e45;
    }
    bVar3 = cmStrToULong(cVar5.Value,&testLoad);
    if (bVar3) goto LAB_001a0e45;
    testLoad = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Invalid value for \'CTEST_TEST_LOAD\' : ");
    poVar6 = std::operator<<(poVar6,(string *)cVar5.Value);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x82,(char *)local_208.View_._M_len,false);
  }
  else {
    bVar3 = cmStrToULong(&this->TestLoad,&testLoad);
    if (bVar3) goto LAB_001a0e45;
    testLoad = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Invalid value for \'TEST_LOAD\' : ");
    poVar6 = std::operator<<(poVar6,(string *)&this->TestLoad);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                 ,0x7b,(char *)local_208.View_._M_len,false);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_001a0e45:
  (this_00->super_cmCTestGenericHandler).TestLoad = testLoad;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)&local_208)
  ;
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar5.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar5.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  if ((this->OutputJUnit)._M_string_length != 0) {
    cmCTestTestHandler::SetJUnitXMLFileName(this_00,&this->OutputJUnit);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestTestCommand::InitializeHandler()
{
  cmValue ctestTimeout = this->Makefile->GetDefinition("CTEST_TEST_TIMEOUT");

  cmDuration timeout;
  if (ctestTimeout) {
    timeout = cmDuration(atof(ctestTimeout->c_str()));
  } else {
    timeout = this->CTest->GetTimeOut();
    if (timeout <= cmDuration::zero()) {
      // By default use timeout of 10 minutes
      timeout = std::chrono::minutes(10);
    }
  }
  this->CTest->SetTimeOut(timeout);

  cmValue resourceSpecFile =
    this->Makefile->GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && resourceSpecFile) {
    this->ResourceSpecFile = *resourceSpecFile;
  }

  cmCTestTestHandler* handler = this->InitializeActualHandler();
  if (!this->Start.empty() || !this->End.empty() || !this->Stride.empty()) {
    handler->SetOption(
      "TestsToRunInformation",
      cmStrCat(this->Start, ',', this->End, ',', this->Stride));
  }
  if (!this->Exclude.empty()) {
    handler->SetOption("ExcludeRegularExpression", this->Exclude);
  }
  if (!this->Include.empty()) {
    handler->SetOption("IncludeRegularExpression", this->Include);
  }
  if (!this->ExcludeLabel.empty()) {
    handler->AddMultiOption("ExcludeLabelRegularExpression",
                            this->ExcludeLabel);
  }
  if (!this->IncludeLabel.empty()) {
    handler->AddMultiOption("LabelRegularExpression", this->IncludeLabel);
  }
  if (!this->ExcludeFixture.empty()) {
    handler->SetOption("ExcludeFixtureRegularExpression",
                       this->ExcludeFixture);
  }
  if (!this->ExcludeFixtureSetup.empty()) {
    handler->SetOption("ExcludeFixtureSetupRegularExpression",
                       this->ExcludeFixtureSetup);
  }
  if (!this->ExcludeFixtureCleanup.empty()) {
    handler->SetOption("ExcludeFixtureCleanupRegularExpression",
                       this->ExcludeFixtureCleanup);
  }
  if (this->StopOnFailure) {
    handler->SetOption("StopOnFailure", "ON");
  }
  if (!this->ParallelLevel.empty()) {
    handler->SetOption("ParallelLevel", this->ParallelLevel);
  }
  if (!this->Repeat.empty()) {
    handler->SetOption("Repeat", this->Repeat);
  }
  if (!this->ScheduleRandom.empty()) {
    handler->SetOption("ScheduleRandom", this->ScheduleRandom);
  }
  if (!this->ResourceSpecFile.empty()) {
    handler->SetOption("ResourceSpecFile", this->ResourceSpecFile);
  }
  if (!this->StopTime.empty()) {
    this->CTest->SetStopTime(this->StopTime);
  }

  // Test load is determined by: TEST_LOAD argument,
  // or CTEST_TEST_LOAD script variable, or ctest --test-load
  // command line argument... in that order.
  unsigned long testLoad;
  cmValue ctestTestLoad = this->Makefile->GetDefinition("CTEST_TEST_LOAD");
  if (!this->TestLoad.empty()) {
    if (!cmStrToULong(this->TestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'TEST_LOAD' : " << this->TestLoad
                                                    << std::endl);
    }
  } else if (cmNonempty(ctestTestLoad)) {
    if (!cmStrToULong(*ctestTestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'CTEST_TEST_LOAD' : " << *ctestTestLoad
                                                          << std::endl);
    }
  } else {
    testLoad = this->CTest->GetTestLoad();
  }
  handler->SetTestLoad(testLoad);

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  if (!this->OutputJUnit.empty()) {
    handler->SetJUnitXMLFileName(this->OutputJUnit);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}